

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::EnumFieldGenerator::GenerateSerializationCode
          (EnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Printer *printer_local;
  EnumFieldGenerator *this_local;
  
  bVar1 = FieldDescriptor::is_required(this->descriptor_);
  if ((!bVar1) || (bVar1 = Params::generate_has((this->super_FieldGenerator).params_), bVar1)) {
    bVar1 = Params::generate_has((this->super_FieldGenerator).params_);
    if (bVar1) {
      io::Printer::Print(printer,&this->variables_,
                         "if (this.$name$ != $default$ || has$capitalized_name$) {\n");
    }
    else {
      io::Printer::Print(printer,&this->variables_,"if (this.$name$ != $default$) {\n");
    }
    io::Printer::Print(printer,&this->variables_,"  output.writeInt32($number$, this.$name$);\n}\n")
    ;
  }
  else {
    io::Printer::Print(printer,&this->variables_,"output.writeInt32($number$, this.$name$);\n");
  }
  return;
}

Assistant:

void EnumFieldGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  if (descriptor_->is_required() && !params_.generate_has()) {
    // Always serialize a required field if we don't have the 'has' signal.
    printer->Print(variables_,
      "output.writeInt32($number$, this.$name$);\n");
  } else {
    if (params_.generate_has()) {
      printer->Print(variables_,
        "if (this.$name$ != $default$ || has$capitalized_name$) {\n");
    } else {
      printer->Print(variables_,
        "if (this.$name$ != $default$) {\n");
    }
    printer->Print(variables_,
      "  output.writeInt32($number$, this.$name$);\n"
      "}\n");
  }
}